

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_gt.cpp
# Opt level: O1

void __thiscall TFIEnergy_ChainF1_Test::TestBody(TFIEnergy_ChainF1_Test *this)

{
  char *message;
  float fVar1;
  AssertionResult gtest_ar;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  AssertHelper local_28;
  float local_1c;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_1c = convert<float>("1.2");
  fVar1 = convert<float>("-0.8");
  fVar1 = tfi::energy::chain::infinite<float>(local_1c,fVar1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (local_18,
             "-1.3375409772289557122297861376619311247381065311346132244923834297492659680725295510811206803209285916"
             ,"ene",-1.337541,fVar1);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/tfi/energy/chain_gt.cpp"
               ,0x27,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_30._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(TFIEnergy, ChainF1) {
  typedef float real_t;
  auto J = convert<real_t>("1.2");
  auto Gamma = convert<real_t>("-0.8");
  auto ene = chain::infinite(J, Gamma);
  EXPECT_FLOAT_EQ(-1.3375409772289557122297861376619311247381065311346132244923834297492659680725295510811206803209285916, ene);
}